

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::Constraint::setUpperBound(Constraint *this,VectorDynSize *upperBound)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar2 = iDynTree::VectorDynSize::size();
  sVar1 = this->m_constraintSize;
  if (sVar2 == sVar1) {
    iDynTree::VectorDynSize::operator=(&this->m_upperBound,upperBound);
    this->m_isUpperBounded = true;
  }
  else {
    iDynTree::reportError
              ("Constraint","setUpperBound",
               "The upperBound dimension is not coherent with the constraint size.");
  }
  return sVar2 == sVar1;
}

Assistant:

bool Constraint::setUpperBound(const VectorDynSize &upperBound)
        {
            if (upperBound.size() != m_constraintSize) {
                reportError("Constraint", "setUpperBound", "The upperBound dimension is not coherent with the constraint size.");
                return false;
            }
            m_upperBound = upperBound;
            m_isUpperBounded = true;
            return true;
        }